

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_pclmul_template.h
# Opt level: O0

u32 crc32_x86_vpclmulqdq_avx512_vl512(u32 crc,u8 *p,size_t len)

{
  byte bVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ushort uVar34;
  undefined1 (*pauVar35) [16];
  ulong uVar36;
  ulong in_RDX;
  undefined1 (*in_RSI) [64];
  uint in_EDI;
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  __m256i y0;
  __m256i mults_256b;
  size_t align;
  __m128i x1;
  __m128i x0;
  __m512i v7;
  __m512i v6;
  __m512i v5;
  __m512i v4;
  __m512i v3;
  __m512i v2;
  __m512i v1;
  __m512i v0;
  __m128i barrett_reduction_constants;
  __m128i mults_128b;
  __m512i mults_1v;
  __m512i mults_2v;
  __m512i mults_4v;
  __m512i mults_8v;
  size_t i;
  __m128i x1_2;
  __m128i x0_2;
  __m128i rshift_1;
  __m128i lshift_1;
  __m128i x1_1;
  __m128i x0_1;
  __m128i rshift;
  __m128i lshift;
  undefined1 local_44c0 [64];
  undefined1 local_4480 [64];
  undefined1 local_4440 [64];
  undefined1 local_4400 [64];
  undefined1 local_43c0 [64];
  undefined1 local_4380 [64];
  undefined1 local_4340 [64];
  undefined1 local_4300 [64];
  undefined1 local_42c0 [64];
  undefined1 local_4280 [64];
  undefined1 local_4240 [64];
  undefined1 local_4200 [64];
  undefined1 local_41c0 [64];
  undefined1 local_4180 [64];
  undefined1 local_4140 [64];
  undefined1 local_4100 [64];
  undefined1 local_40c0 [64];
  undefined1 local_4080 [64];
  undefined1 local_4040 [64];
  undefined1 local_4000 [64];
  undefined1 local_3fc0 [64];
  undefined1 local_3f80 [64];
  undefined1 local_3f40 [64];
  undefined1 local_3f00 [64];
  undefined1 local_3ec0 [64];
  undefined1 local_3e80 [64];
  undefined1 local_3e40 [64];
  undefined1 local_3e00 [64];
  undefined1 local_3dc0 [64];
  undefined1 local_3d80 [64];
  undefined1 local_3d40 [64];
  undefined1 local_3d00 [64];
  undefined1 local_3cc0 [64];
  undefined1 local_3c80 [64];
  undefined1 local_3c40 [64];
  undefined1 local_3c00 [64];
  undefined1 local_3bc0 [64];
  undefined1 local_3b80 [64];
  undefined1 local_3b40 [64];
  undefined1 local_3b00 [64];
  undefined1 local_3ac0 [64];
  undefined1 local_3a80 [64];
  undefined1 local_3a40 [64];
  undefined1 local_3a00 [64];
  undefined1 local_39c0 [64];
  undefined1 local_3980 [64];
  undefined1 local_3940 [64];
  undefined1 local_3900 [64];
  undefined1 local_38c0 [64];
  undefined1 local_3880 [64];
  undefined1 local_3840 [64];
  undefined1 local_3800 [64];
  undefined1 local_37c0 [64];
  undefined1 local_3780 [64];
  undefined1 local_3740 [64];
  undefined1 local_3700 [64];
  undefined1 local_36c0 [64];
  undefined1 local_3680 [64];
  undefined1 local_3640 [64];
  undefined1 local_3600 [64];
  undefined1 local_35c0 [64];
  undefined1 local_3580 [64];
  undefined1 local_3540 [64];
  undefined1 local_3500 [64];
  undefined1 local_34c0 [64];
  undefined1 local_3480 [64];
  undefined1 local_3440 [64];
  undefined1 local_3400 [64];
  ulong local_3388;
  undefined1 local_3380 [64];
  undefined1 local_3340 [64];
  ulong local_32e0;
  undefined1 local_32d0 [16];
  undefined1 local_32c0 [64];
  undefined1 local_3280 [64];
  undefined1 local_3240 [64];
  undefined1 local_3200 [64];
  undefined1 local_31c0 [64];
  undefined1 local_3180 [64];
  undefined1 local_3140 [64];
  undefined1 local_3100 [64];
  ulong local_30a0;
  ulong uStack_3098;
  ulong local_3090;
  ulong uStack_3088;
  undefined1 local_3080 [64];
  undefined1 local_3040 [64];
  undefined1 local_3000 [64];
  undefined1 local_2fc0 [64];
  ulong local_2f58;
  undefined1 (*local_2f50) [64];
  undefined1 local_2f40 [64];
  undefined8 local_2f00;
  undefined8 local_2ef8;
  undefined8 local_2ef0;
  undefined8 local_2ee8;
  undefined8 local_2ee0;
  undefined8 local_2ed8;
  undefined8 local_2ed0;
  undefined8 local_2ec8;
  undefined1 local_2ec0 [64];
  undefined8 local_2e80;
  undefined8 local_2e78;
  undefined8 local_2e70;
  undefined8 local_2e68;
  undefined8 local_2e60;
  undefined8 local_2e58;
  undefined8 local_2e50;
  undefined8 local_2e48;
  undefined1 local_2e40 [64];
  undefined8 local_2e00;
  undefined8 local_2df8;
  undefined8 local_2df0;
  undefined8 local_2de8;
  undefined8 local_2de0;
  undefined8 local_2dd8;
  undefined8 local_2dd0;
  undefined8 local_2dc8;
  undefined1 local_2dc0 [64];
  undefined8 local_2d70;
  undefined8 local_2d68;
  undefined8 local_2d60;
  undefined8 local_2d58;
  undefined8 local_2d50;
  undefined8 local_2d48;
  undefined8 local_2d40;
  undefined8 local_2d38;
  undefined1 local_2d30 [16];
  undefined8 local_2d20;
  undefined8 local_2d18;
  undefined1 local_2d10 [16];
  undefined8 local_2d00;
  undefined8 local_2cf8;
  undefined1 local_2cf0 [16];
  ulong local_2cd0;
  uint local_2cb4;
  ulong local_2c90;
  ulong local_2c80;
  ulong local_2c70;
  undefined8 uStack_2c68;
  ulong local_2c60;
  ulong uStack_2c58;
  ulong local_2ad0;
  ulong uStack_2ac8;
  ulong local_2ac0;
  ulong uStack_2ab8;
  ulong local_2ab0;
  ulong uStack_2aa8;
  undefined1 local_2aa0 [16];
  ulong local_2a90;
  ulong uStack_2a88;
  undefined1 local_2a80 [16];
  ulong local_2a70;
  ulong uStack_2a68;
  ulong local_2a30;
  ulong uStack_2a28;
  ulong local_2a10;
  ulong uStack_2a08;
  ulong local_29c0;
  ulong uStack_29b8;
  ulong local_29a0;
  ulong uStack_2998;
  undefined1 local_2980 [64];
  undefined1 local_2940 [64];
  undefined1 local_2900 [64];
  undefined1 local_28c0 [64];
  undefined1 local_2880 [64];
  undefined1 local_2840 [64];
  undefined1 local_2800 [64];
  undefined1 local_27c0 [64];
  undefined1 (*local_2748) [64];
  undefined1 (*local_2740) [64];
  undefined1 (*local_2738) [64];
  undefined1 (*local_2730) [64];
  undefined1 (*local_2728) [64];
  undefined1 (*local_2720) [64];
  undefined1 (*local_2718) [64];
  undefined1 (*local_2710) [64];
  undefined1 (*local_2708) [64];
  undefined1 (*local_2700) [64];
  undefined1 (*local_26f8) [64];
  undefined1 (*local_26f0) [64];
  undefined1 (*local_26e8) [64];
  undefined1 (*local_26e0) [64];
  undefined1 (*local_26d8) [64];
  undefined1 (*local_26d0) [64];
  undefined1 (*local_26c8) [64];
  undefined1 (*local_26c0) [64];
  undefined1 (*local_26b8) [64];
  undefined1 (*local_26b0) [64];
  undefined1 (*local_26a8) [64];
  undefined1 (*local_26a0) [64];
  undefined1 (*local_2690) [64];
  undefined1 (*local_2688) [64];
  undefined1 (*local_2680) [64];
  ulong local_2670;
  undefined8 uStack_2668;
  ulong local_2660;
  ulong uStack_2658;
  ulong local_2650;
  undefined8 uStack_2648;
  ulong local_2640;
  ulong uStack_2638;
  ulong local_2630;
  ulong uStack_2628;
  ulong local_2540;
  ulong uStack_2538;
  ulong local_2520;
  ulong uStack_2518;
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 local_24d0;
  undefined8 uStack_24c8;
  ulong local_24c0;
  ulong uStack_24b8;
  ulong local_24b0;
  undefined1 (*local_24a8) [16];
  ulong local_24a0;
  ulong uStack_2498;
  undefined8 local_2490;
  undefined8 uStack_2488;
  ulong local_2480;
  ulong uStack_2478;
  undefined8 local_2470;
  undefined8 uStack_2468;
  ulong local_2460;
  ulong uStack_2458;
  undefined1 (*local_2448) [16];
  undefined1 (*local_2440) [16];
  undefined1 (*local_2438) [16];
  ulong local_2430;
  ulong uStack_2428;
  ulong local_2420;
  ulong uStack_2418;
  ulong local_2410;
  ulong uStack_2408;
  undefined1 local_2400 [16];
  ulong local_23f0;
  ulong uStack_23e8;
  undefined1 local_23e0 [16];
  ulong local_23d0;
  ulong uStack_23c8;
  undefined1 local_23c0 [64];
  undefined1 local_2380 [64];
  undefined1 local_2340 [4] [64];
  undefined1 local_2240 [64];
  undefined1 local_2200 [64];
  undefined1 local_21c0 [64];
  undefined1 local_2180 [64];
  undefined1 local_2140 [64];
  undefined1 local_2100 [64];
  undefined1 local_20c0 [64];
  undefined1 local_2080 [64];
  undefined1 local_2040 [64];
  undefined1 local_2000 [64];
  undefined1 local_1fc0 [64];
  undefined1 local_1f80 [64];
  undefined1 local_1f40 [64];
  undefined1 local_1f00 [64];
  undefined1 local_1ec0 [64];
  undefined1 local_1e80 [64];
  undefined1 local_1e40 [64];
  undefined1 local_1e00 [64];
  undefined1 local_1dc0 [64];
  undefined1 local_1d80 [64];
  undefined1 local_1d40 [64];
  undefined1 local_1d00 [64];
  undefined1 local_1cc0 [64];
  undefined1 local_1c80 [64];
  undefined1 local_1c40 [64];
  undefined1 local_1c00 [64];
  undefined1 local_1bc0 [64];
  undefined1 local_1b80 [64];
  undefined1 local_1b40 [64];
  undefined1 local_1b00 [64];
  undefined1 local_1ac0 [64];
  undefined1 local_1a80 [64];
  undefined1 local_1a40 [64];
  undefined1 local_1a00 [64];
  undefined1 local_19c0 [64];
  undefined1 local_1980 [64];
  undefined1 local_1940 [64];
  undefined1 local_1900 [64];
  undefined1 local_18c0 [64];
  undefined1 local_1880 [64];
  undefined1 local_1840 [64];
  undefined1 local_1800 [64];
  undefined1 local_17c0 [64];
  undefined1 local_1780 [64];
  undefined1 local_1740 [64];
  undefined1 local_1700 [64];
  undefined1 local_16c0 [64];
  undefined1 local_1680 [64];
  undefined1 local_1640 [64];
  undefined1 local_1600 [64];
  undefined1 local_15c0 [64];
  undefined1 local_1580 [64];
  undefined1 local_1540 [64];
  undefined1 local_1500 [64];
  undefined1 local_14c0 [64];
  undefined1 local_1480 [64];
  undefined1 local_1440 [64];
  undefined1 local_1400 [64];
  undefined1 local_13c0 [64];
  undefined1 local_1380 [64];
  undefined1 local_1340 [64];
  undefined1 local_1300 [64];
  undefined1 local_12c0 [64];
  undefined1 local_1280 [64];
  undefined1 local_1240 [64];
  undefined1 local_1200 [64];
  undefined1 local_11c0 [64];
  undefined1 local_1180 [64];
  undefined1 local_1140 [64];
  undefined1 local_1100 [64];
  undefined1 local_10c0 [64];
  undefined1 local_1080 [64];
  undefined1 local_1040 [64];
  undefined1 local_1000 [64];
  undefined1 local_fc0 [64];
  undefined1 local_f80 [64];
  undefined1 local_f40 [64];
  undefined1 local_f00 [64];
  undefined1 local_ec0 [64];
  undefined1 local_e80 [64];
  undefined1 local_e40 [64];
  undefined1 local_e00 [64];
  undefined1 local_dc0 [64];
  undefined1 local_d80 [64];
  undefined1 local_d40 [64];
  undefined1 local_d00 [64];
  undefined1 local_cc0 [64];
  undefined1 local_c80 [64];
  undefined1 local_c40 [64];
  undefined1 local_c00 [64];
  undefined1 local_bc0 [64];
  undefined1 local_b80 [64];
  undefined1 local_b40 [64];
  undefined1 local_b00 [64];
  undefined1 local_ac0 [64];
  undefined1 local_a80 [64];
  undefined1 local_a40 [64];
  undefined1 local_a00 [64];
  undefined1 local_9c0 [64];
  undefined1 local_980 [64];
  undefined1 local_940 [64];
  undefined1 local_900 [64];
  undefined1 local_8c0 [64];
  undefined1 local_880 [64];
  undefined1 local_840 [64];
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [64];
  undefined1 local_680 [64];
  undefined1 local_640 [64];
  undefined1 local_600 [64];
  undefined1 local_5c0 [64];
  undefined1 local_580 [64];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined1 local_90 [16];
  
  local_2d38 = 0xc30f51d;
  local_2d40 = 0x1072db28;
  local_2d48 = 0xc30f51d;
  local_2d50 = 0x1072db28;
  local_2d58 = 0xc30f51d;
  local_2d60 = 0x1072db28;
  local_2d68 = 0xc30f51d;
  local_2d70 = 0x1072db28;
  auVar37 = vpunpcklqdq_avx(ZEXT816(0x1072db28),ZEXT816(0xc30f51d));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0x1072db28),ZEXT816(0xc30f51d));
  auVar44._0_16_ = ZEXT116(0) * auVar37 + ZEXT116(1) * auVar2;
  auVar44._16_16_ = ZEXT116(1) * auVar37;
  auVar37 = vpunpcklqdq_avx(ZEXT816(0x1072db28),ZEXT816(0xc30f51d));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0x1072db28),ZEXT816(0xc30f51d));
  auVar38 = vinserti64x4_avx512f
                      (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar37,
                                           ZEXT116(0) * auVar37 + ZEXT116(1) * auVar2)),auVar44,1);
  local_2dc0 = vmovdqa64_avx512f(auVar38);
  auVar38 = vmovdqa64_avx512f(local_2dc0);
  local_2fc0 = vmovdqa64_avx512f(auVar38);
  local_2dc8 = 0xe95c1271;
  local_2dd0 = 0xce3371cb;
  local_2dd8 = 0xe95c1271;
  local_2de0 = 0xce3371cb;
  local_2de8 = 0xe95c1271;
  local_2df0 = 0xce3371cb;
  local_2df8 = 0xe95c1271;
  local_2e00 = 0xce3371cb;
  auVar37 = vpunpcklqdq_avx(ZEXT816(0xce3371cb),ZEXT816(0xe95c1271));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0xce3371cb),ZEXT816(0xe95c1271));
  auVar45._0_16_ = ZEXT116(0) * auVar37 + ZEXT116(1) * auVar2;
  auVar45._16_16_ = ZEXT116(1) * auVar37;
  auVar37 = vpunpcklqdq_avx(ZEXT816(0xce3371cb),ZEXT816(0xe95c1271));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0xce3371cb),ZEXT816(0xe95c1271));
  auVar38 = vinserti64x4_avx512f
                      (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar37,
                                           ZEXT116(0) * auVar37 + ZEXT116(1) * auVar2)),auVar45,1);
  local_2e40 = vmovdqa64_avx512f(auVar38);
  auVar38 = vmovdqa64_avx512f(local_2e40);
  local_3000 = vmovdqa64_avx512f(auVar38);
  local_2e48 = 0x910eeec1;
  local_2e50 = 0x33fff533;
  local_2e58 = 0x910eeec1;
  local_2e60 = 0x33fff533;
  local_2e68 = 0x910eeec1;
  local_2e70 = 0x33fff533;
  local_2e78 = 0x910eeec1;
  local_2e80 = 0x33fff533;
  auVar37 = vpunpcklqdq_avx(ZEXT816(0x33fff533),ZEXT816(0x910eeec1));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0x33fff533),ZEXT816(0x910eeec1));
  auVar46._0_16_ = ZEXT116(0) * auVar37 + ZEXT116(1) * auVar2;
  auVar46._16_16_ = ZEXT116(1) * auVar37;
  auVar37 = vpunpcklqdq_avx(ZEXT816(0x33fff533),ZEXT816(0x910eeec1));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0x33fff533),ZEXT816(0x910eeec1));
  auVar38 = vinserti64x4_avx512f
                      (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar37,
                                           ZEXT116(0) * auVar37 + ZEXT116(1) * auVar2)),auVar46,1);
  local_2ec0 = vmovdqa64_avx512f(auVar38);
  auVar38 = vmovdqa64_avx512f(local_2ec0);
  local_3040 = vmovdqa64_avx512f(auVar38);
  local_2ec8 = 0x1d9513d7;
  local_2ed0 = 0x8f352d95;
  local_2ed8 = 0x1d9513d7;
  local_2ee0 = 0x8f352d95;
  local_2ee8 = 0x1d9513d7;
  local_2ef0 = 0x8f352d95;
  local_2ef8 = 0x1d9513d7;
  local_2f00 = 0x8f352d95;
  auVar37 = vpunpcklqdq_avx(ZEXT816(0x8f352d95),ZEXT816(0x1d9513d7));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0x8f352d95),ZEXT816(0x1d9513d7));
  auVar47._0_16_ = ZEXT116(0) * auVar37 + ZEXT116(1) * auVar2;
  auVar47._16_16_ = ZEXT116(1) * auVar37;
  auVar37 = vpunpcklqdq_avx(ZEXT816(0x8f352d95),ZEXT816(0x1d9513d7));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0x8f352d95),ZEXT816(0x1d9513d7));
  auVar38 = vinserti64x4_avx512f
                      (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar37,
                                           ZEXT116(0) * auVar37 + ZEXT116(1) * auVar2)),auVar47,1);
  local_2f40 = vmovdqa64_avx512f(auVar38);
  auVar38 = vmovdqa64_avx512f(local_2f40);
  local_3080 = vmovdqa64_avx512f(auVar38);
  local_2cf8 = 0xccaa009e;
  local_2d00 = 0xae689191;
  local_2d10 = vpunpcklqdq_avx(ZEXT816(0xae689191),ZEXT816(0xccaa009e));
  local_3090 = local_2d10._0_8_;
  uStack_3088 = local_2d10._8_8_;
  local_2d18 = 0x1db710641;
  local_2d20 = 0xb4e5b025f7011641;
  local_2d30 = vpunpcklqdq_avx(ZEXT816(0xb4e5b025f7011641),ZEXT816(0x1db710641));
  local_30a0 = local_2d30._0_8_;
  uStack_3098 = local_2d30._8_8_;
  auVar37 = ZEXT416(in_EDI);
  local_2cf0._4_4_ = 0;
  local_2cf0._0_4_ = in_EDI;
  local_32d0._0_8_ = local_2cf0._0_8_;
  local_32d0._8_8_ = 0;
  local_2f58 = in_RDX;
  local_2f50 = in_RSI;
  local_2cf0 = auVar37;
  if (in_RDX < 0x200) {
    if (in_RDX < 0x40) {
      if (in_RDX < 0x10) {
        if (in_RDX < 4) {
          local_2cb4 = in_EDI;
          for (local_2cd0 = 0; local_2cd0 < in_RDX; local_2cd0 = local_2cd0 + 1) {
            local_2cb4 = local_2cb4 >> 8 ^
                         crc32_slice1_table
                         [(int)(local_2cb4 & 0xff ^ (uint)(byte)(*in_RSI)[local_2cd0])];
          }
          return local_2cb4;
        }
        local_2f58._0_1_ = (byte)in_RDX;
        uVar34 = (short)(1 << ((byte)local_2f58 & 0x1f)) - 1;
        auVar37 = vmovdqu8_avx512vl(*(undefined1 (*) [16])*in_RSI);
        bVar1 = (byte)(uVar34 >> 8);
        auVar29[9] = (bVar1 >> 1 & 1) * auVar37[9];
        auVar29[8] = (char)((uVar34 & 0x101) >> 8) * auVar37[8];
        auVar29[10] = (bVar1 >> 2 & 1) * auVar37[10];
        auVar29[0xb] = (bVar1 >> 3 & 1) * auVar37[0xb];
        auVar29[0xc] = (bVar1 >> 4 & 1) * auVar37[0xc];
        auVar29[0xd] = (bVar1 >> 5 & 1) * auVar37[0xd];
        auVar29[0xe] = (bVar1 >> 6 & 1) * auVar37[0xe];
        auVar29[0xf] = -((char)bVar1 >> 7) * auVar37[0xf];
        auVar29._0_8_ =
             local_2cf0._0_8_ ^
             CONCAT17(((byte)(uVar34 >> 7) & 1) * auVar37[7],
                      CONCAT16(((byte)(uVar34 >> 6) & 1) * auVar37[6],
                               CONCAT15(((byte)(uVar34 >> 5) & 1) * auVar37[5],
                                        CONCAT14(((byte)(uVar34 >> 4) & 1) * auVar37[4],
                                                 CONCAT13(((byte)(uVar34 >> 3) & 1) * auVar37[3],
                                                          CONCAT12(((byte)(uVar34 >> 2) & 1) *
                                                                   auVar37[2],
                                                                   CONCAT11(((byte)(uVar34 >> 1) & 1
                                                                            ) * auVar37[1],
                                                                            (char)(uVar34 & 0x101) *
                                                                            auVar37[0])))))));
        local_32d0 = vpshufb_avx(auVar29,*(undefined1 (*) [16])(shift_tab + in_RDX));
      }
      else {
        local_32d0._0_8_ = *(ulong *)*in_RSI ^ local_2cf0._0_8_;
        local_32d0._8_8_ = *(ulong *)(*in_RSI + 8);
        if (0x1f < in_RDX) {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_32d0._0_8_;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = local_2d10._0_8_;
          auVar37 = (undefined1  [16])0x0;
          for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
            if ((auVar4 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
              auVar37 = auVar37 ^ auVar9 << uVar3;
            }
          }
          local_29a0 = auVar37._0_8_;
          uStack_2998 = auVar37._8_8_;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = *(ulong *)(*in_RSI + 8);
          auVar23._8_8_ = 0;
          auVar23._0_8_ = local_2d10._8_8_;
          auVar37 = (undefined1  [16])0x0;
          for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
            if ((auVar18 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
              auVar37 = auVar37 ^ auVar23 << uVar3;
            }
          }
          local_29c0 = auVar37._0_8_;
          uStack_29b8 = auVar37._8_8_;
          local_32d0._0_8_ = *(ulong *)(*in_RSI + 0x10) ^ local_29a0 ^ local_29c0;
          local_32d0._8_8_ = *(ulong *)(*in_RSI + 0x18) ^ uStack_2998 ^ uStack_29b8;
          if (0x2f < in_RDX) {
            auVar5._8_8_ = 0;
            auVar5._0_8_ = local_32d0._0_8_;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = local_2d10._0_8_;
            auVar37 = (undefined1  [16])0x0;
            for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
              if ((auVar5 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
                auVar37 = auVar37 ^ auVar10 << uVar3;
              }
            }
            local_2a10 = auVar37._0_8_;
            uStack_2a08 = auVar37._8_8_;
            auVar19._8_8_ = 0;
            auVar19._0_8_ = local_32d0._8_8_;
            auVar24._8_8_ = 0;
            auVar24._0_8_ = local_2d10._8_8_;
            auVar37 = (undefined1  [16])0x0;
            for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
              if ((auVar19 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
                auVar37 = auVar37 ^ auVar24 << uVar3;
              }
            }
            local_2a30 = auVar37._0_8_;
            uStack_2a28 = auVar37._8_8_;
            local_32d0._8_8_ = *(ulong *)(*in_RSI + 0x28) ^ uStack_2a08 ^ uStack_2a28;
            local_32d0._0_8_ = *(ulong *)(*in_RSI + 0x20) ^ local_2a10 ^ local_2a30;
          }
        }
        uVar36 = in_RDX & 0xf;
        if (uVar36 != 0) {
          auVar2 = vpshufb_avx(local_32d0,*(undefined1 (*) [16])(shift_tab + uVar36));
          auVar37 = vpshufb_avx(local_32d0,*(undefined1 (*) [16])(shift_tab + uVar36 + 0x10));
          auVar37 = vpblendvb_avx(auVar37,*(undefined1 (*) [16])
                                           (in_RSI[-1] +
                                           uVar36 + (in_RDX & 0xfffffffffffffff0) + 0x30),
                                  *(undefined1 (*) [16])(shift_tab + uVar36 + 0x10));
          local_2630 = auVar2._0_8_;
          uStack_2628 = auVar2._8_8_;
          local_2640 = auVar37._0_8_;
          uStack_2638 = auVar37._8_8_;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = local_2630;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = local_2d10._0_8_;
          auVar37 = (undefined1  [16])0x0;
          for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
            if ((auVar7 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
              auVar37 = auVar37 ^ auVar12 << uVar3;
            }
          }
          local_2520 = auVar37._0_8_;
          uStack_2518 = auVar37._8_8_;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = uStack_2628;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = local_2d10._8_8_;
          auVar37 = (undefined1  [16])0x0;
          for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
            if ((auVar22 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
              auVar37 = auVar37 ^ auVar27 << uVar3;
            }
          }
          local_2540 = auVar37._0_8_;
          uStack_2538 = auVar37._8_8_;
          local_32d0._8_8_ = uStack_2638 ^ uStack_2518 ^ uStack_2538;
          local_32d0._0_8_ = local_2640 ^ local_2520 ^ local_2540;
        }
      }
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_32d0._0_8_;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_2d10._8_8_;
      auVar37 = (undefined1  [16])0x0;
      for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
        if ((auVar14 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
          auVar37 = auVar37 ^ auVar16 << uVar3;
        }
      }
      auVar43 = vpsrldq_avx(local_32d0,8);
      local_2c80 = auVar37._0_8_;
      local_2c90 = auVar43._0_8_;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_2c80 ^ local_2c90;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_2d30._0_8_;
      auVar2 = (undefined1  [16])0x0;
      for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
        if ((auVar8 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
          auVar2 = auVar2 ^ auVar13 << uVar3;
        }
      }
      local_32e0 = auVar2._0_8_;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_32e0;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_2d30._8_8_;
      auVar2 = (undefined1  [16])0x0;
      for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
        if ((auVar15 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
          auVar2 = auVar2 ^ auVar17 << uVar3;
        }
      }
      local_32d0._8_4_ = auVar37._8_4_ ^ auVar43._8_4_ ^ auVar2._8_4_;
      return local_32d0._8_4_;
    }
    auVar38 = vmovdqu64_avx512f(*in_RSI);
    local_2650 = local_2cf0._0_8_;
    uStack_2648 = 0;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_2cf0._0_8_;
    local_f0 = (undefined1  [16])0x0;
    auVar39 = vinserti64x4_avx512f(ZEXT1664(ZEXT116(1) * auVar31),ZEXT1632((undefined1  [16])0x0),1)
    ;
    local_3340 = vmovdqa64_avx512f(auVar38);
    local_3380 = vmovdqa64_avx512f(auVar39);
    memcpy(local_2840,local_3380,0x40);
    memcpy(local_2880,local_3340,0x40);
    auVar38 = vmovdqa64_avx512f(local_2880);
    auVar39 = vmovdqa64_avx512f(local_2840);
    local_27c0 = vmovdqa64_avx512f(auVar38);
    local_2800 = vmovdqa64_avx512f(auVar39);
    auVar38 = vmovdqa64_avx512f(local_27c0);
    auVar38 = vpxorq_avx512f(auVar38,local_2800);
    local_3100 = vmovdqa64_avx512f(auVar38);
    if (local_2f58 < 0x80) goto LAB_001266be;
    local_2680 = local_2f50 + 1;
    auVar38 = vmovdqu64_avx512f(*local_2680);
    local_3140 = vmovdqa64_avx512f(auVar38);
    if (0xff < local_2f58) {
      local_2688 = local_2f50 + 2;
      auVar38 = vmovdqu64_avx512f(*local_2688);
      local_3180 = vmovdqa64_avx512f(auVar38);
      local_2690 = local_2f50 + 3;
      auVar38 = vmovdqu64_avx512f(*local_2690);
      local_31c0 = vmovdqa64_avx512f(auVar38);
      local_2f50 = local_2f50 + 4;
      goto LAB_00125f92;
    }
    local_2f50 = local_2f50 + 2;
  }
  else {
    if ((in_RDX < 0x10001) || (((ulong)in_RSI & 0x3f) == 0)) {
      auVar38 = vmovdqu64_avx512f(*in_RSI);
      local_2670 = local_2cf0._0_8_;
      uStack_2668 = 0;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = local_2cf0._0_8_;
      local_d0 = (undefined1  [16])0x0;
      auVar39 = vinserti64x4_avx512f
                          (ZEXT1664(ZEXT116(1) * auVar37),ZEXT1632((undefined1  [16])0x0),1);
      local_3400 = vmovdqa64_avx512f(auVar38);
      local_3440 = vmovdqa64_avx512f(auVar39);
      memcpy(local_2940,local_3440,0x40);
      memcpy(local_2980,local_3400,0x40);
      auVar38 = vmovdqa64_avx512f(local_2980);
      auVar39 = vmovdqa64_avx512f(local_2940);
      local_28c0 = vmovdqa64_avx512f(auVar38);
      local_2900 = vmovdqa64_avx512f(auVar39);
      auVar38 = vmovdqa64_avx512f(local_28c0);
      auVar38 = vpxorq_avx512f(auVar38,local_2900);
      local_3100 = vmovdqa64_avx512f(auVar38);
    }
    else {
      uVar36 = -(long)in_RSI;
      local_3388 = uVar36 & 0x3f;
      local_2f58 = in_RDX - local_3388;
      local_2c60 = *(ulong *)*in_RSI;
      uStack_2c58 = *(ulong *)(*in_RSI + 8);
      local_2c70 = local_2cf0._0_8_;
      uStack_2c68 = 0;
      uVar28 = local_2c60 ^ local_2cf0._0_8_;
      pauVar35 = (undefined1 (*) [16])(*in_RSI + 0x10);
      local_2f50 = (undefined1 (*) [64])pauVar35;
      local_32d0._0_8_ = uVar28;
      local_32d0._8_8_ = uStack_2c58;
      if ((uVar36 & 0xf) != 0) {
        local_24b0 = uVar36 & 0xf;
        local_24c0 = local_2d10._0_8_;
        uStack_24b8 = local_2d10._8_8_;
        local_2438 = (undefined1 (*) [16])(shift_tab + local_24b0);
        local_2470 = *(undefined8 *)*local_2438;
        uStack_2468 = *(undefined8 *)(shift_tab + local_24b0 + 8);
        local_2440 = (undefined1 (*) [16])(shift_tab + local_24b0 + 0x10);
        local_b0 = *(undefined8 *)*local_2440;
        uStack_a8 = *(undefined8 *)(shift_tab + local_24b0 + 0x18);
        auVar33._8_8_ = uStack_2c58;
        auVar33._0_8_ = uVar28;
        local_24f0 = vpshufb_avx(auVar33,*local_2438);
        auVar32._8_8_ = uStack_2c58;
        auVar32._0_8_ = uVar28;
        local_90 = vpshufb_avx(auVar32,*local_2440);
        local_2448 = (undefined1 (*) [16])(pauVar35[-1] + local_24b0);
        local_a0 = *(undefined8 *)*local_2448;
        uStack_98 = *(undefined8 *)(pauVar35[-1] + local_24b0 + 8);
        local_2500 = vpblendvb_avx(local_90,*local_2448,*local_2440);
        local_2410 = local_24f0._0_8_;
        uStack_2408 = local_24f0._8_8_;
        local_2430 = local_2d10._0_8_;
        uStack_2428 = local_2d10._8_8_;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_24f0._0_8_;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = local_2d10._0_8_;
        local_23e0 = (undefined1  [16])0x0;
        for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
          if ((auVar2 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
            local_23e0 = local_23e0 ^ auVar43 << uVar3;
          }
        }
        local_23d0 = local_2500._0_8_;
        uStack_23c8 = local_2500._8_8_;
        local_23f0 = local_2500._0_8_ ^ local_23e0._0_8_;
        uStack_23e8 = local_2500._8_8_ ^ local_23e0._8_8_;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = local_24f0._8_8_;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = local_2d10._8_8_;
        local_2400 = (undefined1  [16])0x0;
        for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
          if ((auVar20 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
            local_2400 = local_2400 ^ auVar25 << uVar3;
          }
        }
        local_32d0._0_8_ = local_23f0 ^ local_2400._0_8_;
        local_32d0._8_8_ = uStack_23e8 ^ local_2400._8_8_;
        local_2f50 = (undefined1 (*) [64])(*pauVar35 + (uVar36 & 0xf));
        local_3388 = uVar36 & 0x30;
        uStack_2418 = local_32d0._8_8_;
        local_2420 = local_32d0._0_8_;
        uStack_2458 = uStack_2c58;
        local_2460 = uVar28;
        uStack_2478 = uStack_2c58;
        local_2480 = uVar28;
        uStack_2488 = uStack_a8;
        local_2490 = local_b0;
        uStack_2498 = uStack_2c58;
        local_24a0 = uVar28;
        local_24a8 = pauVar35;
        uStack_24c8 = uStack_2468;
        local_24d0 = local_2470;
        uStack_24d8 = uStack_a8;
        local_24e0 = local_b0;
      }
      for (; local_3388 != 0; local_3388 = local_3388 - 0x10) {
        local_2ab0 = local_32d0._0_8_;
        uStack_2aa8 = local_32d0._8_8_;
        local_2a70 = *(ulong *)*local_2f50;
        uStack_2a68 = *(ulong *)(*local_2f50 + 8);
        local_2ad0 = local_2d10._0_8_;
        uStack_2ac8 = local_2d10._8_8_;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_32d0._0_8_;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_2d10._0_8_;
        local_2a80 = (undefined1  [16])0x0;
        for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
          if ((auVar6 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
            local_2a80 = local_2a80 ^ auVar11 << uVar3;
          }
        }
        local_2a90 = local_2a70 ^ local_2a80._0_8_;
        uStack_2a88 = uStack_2a68 ^ local_2a80._8_8_;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = local_32d0._8_8_;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = local_2d10._8_8_;
        local_2aa0 = (undefined1  [16])0x0;
        for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
          if ((auVar21 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
            local_2aa0 = local_2aa0 ^ auVar26 << uVar3;
          }
        }
        local_2ac0 = local_2a90 ^ local_2aa0._0_8_;
        uStack_2ab8 = uStack_2a88 ^ local_2aa0._8_8_;
        local_2f50 = (undefined1 (*) [64])((long)local_2f50 + 0x10);
        local_32d0._0_8_ = local_2ac0;
        local_32d0._8_8_ = uStack_2ab8;
      }
      local_2660 = local_32d0._0_8_;
      uStack_2658 = local_32d0._8_8_;
      auVar30._8_8_ = local_32d0._8_8_;
      auVar30._0_8_ = local_32d0._0_8_;
      local_e0 = (undefined1  [16])0x0;
      auVar38 = vinserti64x4_avx512f
                          (ZEXT1664(ZEXT116(1) * auVar30),ZEXT1632((undefined1  [16])0x0),1);
      auVar38 = vmovdqa64_avx512f(auVar38);
      auVar38 = vmovdqa64_avx512f(auVar38);
      auVar38 = vinserti32x4_avx512f(auVar38,*(undefined1 (*) [16])local_2f50,1);
      auVar38 = vmovdqa64_avx512f(auVar38);
      auVar38 = vmovdqa64_avx512f(auVar38);
      auVar38 = vinserti64x4_avx512f(auVar38,*(undefined1 (*) [32])((long)local_2f50 + 0x10),1);
      local_3100 = vmovdqa64_avx512f(auVar38);
      local_2f50 = (undefined1 (*) [64])((long)local_2f50 + -0x10);
    }
    local_26a0 = local_2f50 + 1;
    auVar38 = vmovdqu64_avx512f(*local_26a0);
    local_3140 = vmovdqa64_avx512f(auVar38);
    local_26a8 = local_2f50 + 2;
    auVar38 = vmovdqu64_avx512f(*local_26a8);
    local_3180 = vmovdqa64_avx512f(auVar38);
    local_26b0 = local_2f50 + 3;
    auVar38 = vmovdqu64_avx512f(*local_26b0);
    local_31c0 = vmovdqa64_avx512f(auVar38);
    local_26b8 = local_2f50 + 4;
    auVar38 = vmovdqu64_avx512f(*local_26b8);
    local_3200 = vmovdqa64_avx512f(auVar38);
    local_26c0 = local_2f50 + 5;
    auVar38 = vmovdqu64_avx512f(*local_26c0);
    local_3240 = vmovdqa64_avx512f(auVar38);
    local_26c8 = local_2f50 + 6;
    auVar38 = vmovdqu64_avx512f(*local_26c8);
    local_3280 = vmovdqa64_avx512f(auVar38);
    local_26d0 = local_2f50 + 7;
    auVar38 = vmovdqu64_avx512f(*local_26d0);
    local_32c0 = vmovdqa64_avx512f(auVar38);
    for (; local_2f50 = local_2f50 + 8, 0x3ff < local_2f58; local_2f58 = local_2f58 - 0x200) {
      auVar38 = vmovdqa64_avx512f(local_3100);
      local_26d8 = local_2f50;
      auVar39 = vmovdqu64_avx512f(*local_2f50);
      auVar40 = vmovdqa64_avx512f(local_2fc0);
      local_3480 = vmovdqa64_avx512f(auVar38);
      local_34c0 = vmovdqa64_avx512f(auVar39);
      local_3500 = vmovdqa64_avx512f(auVar40);
      memcpy(local_3c0,local_3500,0x40);
      memcpy(local_400,local_34c0,0x40);
      memcpy(local_440,local_3480,0x40);
      auVar38 = vmovdqa64_avx512f(local_440);
      auVar39 = vmovdqa64_avx512f(local_400);
      auVar40 = vmovdqa64_avx512f(local_3c0);
      local_300 = vmovdqa64_avx512f(auVar38);
      local_340 = vmovdqa64_avx512f(auVar39);
      local_380 = vmovdqa64_avx512f(auVar40);
      auVar38 = vmovdqa64_avx512f(local_300);
      auVar39 = vmovdqa64_avx512f(local_380);
      auVar40 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0);
      auVar38 = vmovdqa64_avx512f(local_300);
      auVar39 = vmovdqa64_avx512f(local_380);
      auVar39 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0x11);
      auVar38 = vmovdqa64_avx512f(local_340);
      auVar38 = vpternlogd_avx512f(auVar40,auVar39,auVar38,0x96);
      local_3100 = vmovdqa64_avx512f(auVar38);
      auVar38 = vmovdqa64_avx512f(local_3140);
      local_26e0 = local_2f50 + 1;
      auVar39 = vmovdqu64_avx512f(*local_26e0);
      auVar40 = vmovdqa64_avx512f(local_2fc0);
      local_3540 = vmovdqa64_avx512f(auVar38);
      local_3580 = vmovdqa64_avx512f(auVar39);
      local_35c0 = vmovdqa64_avx512f(auVar40);
      memcpy(local_540,local_35c0,0x40);
      memcpy(local_580,local_3580,0x40);
      memcpy(local_5c0,local_3540,0x40);
      auVar38 = vmovdqa64_avx512f(local_5c0);
      auVar39 = vmovdqa64_avx512f(local_580);
      auVar40 = vmovdqa64_avx512f(local_540);
      local_480 = vmovdqa64_avx512f(auVar38);
      local_4c0 = vmovdqa64_avx512f(auVar39);
      local_500 = vmovdqa64_avx512f(auVar40);
      auVar38 = vmovdqa64_avx512f(local_480);
      auVar39 = vmovdqa64_avx512f(local_500);
      auVar40 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0);
      auVar38 = vmovdqa64_avx512f(local_480);
      auVar39 = vmovdqa64_avx512f(local_500);
      auVar39 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0x11);
      auVar38 = vmovdqa64_avx512f(local_4c0);
      auVar38 = vpternlogd_avx512f(auVar40,auVar39,auVar38,0x96);
      local_3140 = vmovdqa64_avx512f(auVar38);
      auVar38 = vmovdqa64_avx512f(local_3180);
      local_26e8 = local_2f50 + 2;
      auVar39 = vmovdqu64_avx512f(*local_26e8);
      auVar40 = vmovdqa64_avx512f(local_2fc0);
      local_3600 = vmovdqa64_avx512f(auVar38);
      local_3640 = vmovdqa64_avx512f(auVar39);
      local_3680 = vmovdqa64_avx512f(auVar40);
      memcpy(local_6c0,local_3680,0x40);
      memcpy(local_700,local_3640,0x40);
      memcpy(local_740,local_3600,0x40);
      auVar38 = vmovdqa64_avx512f(local_740);
      auVar39 = vmovdqa64_avx512f(local_700);
      auVar40 = vmovdqa64_avx512f(local_6c0);
      local_600 = vmovdqa64_avx512f(auVar38);
      local_640 = vmovdqa64_avx512f(auVar39);
      local_680 = vmovdqa64_avx512f(auVar40);
      auVar38 = vmovdqa64_avx512f(local_600);
      auVar39 = vmovdqa64_avx512f(local_680);
      auVar40 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0);
      auVar38 = vmovdqa64_avx512f(local_600);
      auVar39 = vmovdqa64_avx512f(local_680);
      auVar39 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0x11);
      auVar38 = vmovdqa64_avx512f(local_640);
      auVar38 = vpternlogd_avx512f(auVar40,auVar39,auVar38,0x96);
      local_3180 = vmovdqa64_avx512f(auVar38);
      auVar38 = vmovdqa64_avx512f(local_31c0);
      local_26f0 = local_2f50 + 3;
      auVar39 = vmovdqu64_avx512f(*local_26f0);
      auVar40 = vmovdqa64_avx512f(local_2fc0);
      local_36c0 = vmovdqa64_avx512f(auVar38);
      local_3700 = vmovdqa64_avx512f(auVar39);
      local_3740 = vmovdqa64_avx512f(auVar40);
      memcpy(local_840,local_3740,0x40);
      memcpy(local_880,local_3700,0x40);
      memcpy(local_8c0,local_36c0,0x40);
      auVar38 = vmovdqa64_avx512f(local_8c0);
      auVar39 = vmovdqa64_avx512f(local_880);
      auVar40 = vmovdqa64_avx512f(local_840);
      local_780 = vmovdqa64_avx512f(auVar38);
      local_7c0 = vmovdqa64_avx512f(auVar39);
      local_800 = vmovdqa64_avx512f(auVar40);
      auVar38 = vmovdqa64_avx512f(local_780);
      auVar39 = vmovdqa64_avx512f(local_800);
      auVar40 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0);
      auVar38 = vmovdqa64_avx512f(local_780);
      auVar39 = vmovdqa64_avx512f(local_800);
      auVar39 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0x11);
      auVar38 = vmovdqa64_avx512f(local_7c0);
      auVar38 = vpternlogd_avx512f(auVar40,auVar39,auVar38,0x96);
      local_31c0 = vmovdqa64_avx512f(auVar38);
      auVar38 = vmovdqa64_avx512f(local_3200);
      local_26f8 = local_2f50 + 4;
      auVar39 = vmovdqu64_avx512f(*local_26f8);
      auVar40 = vmovdqa64_avx512f(local_2fc0);
      local_3780 = vmovdqa64_avx512f(auVar38);
      local_37c0 = vmovdqa64_avx512f(auVar39);
      local_3800 = vmovdqa64_avx512f(auVar40);
      memcpy(local_9c0,local_3800,0x40);
      memcpy(local_a00,local_37c0,0x40);
      memcpy(local_a40,local_3780,0x40);
      auVar38 = vmovdqa64_avx512f(local_a40);
      auVar39 = vmovdqa64_avx512f(local_a00);
      auVar40 = vmovdqa64_avx512f(local_9c0);
      local_900 = vmovdqa64_avx512f(auVar38);
      local_940 = vmovdqa64_avx512f(auVar39);
      local_980 = vmovdqa64_avx512f(auVar40);
      auVar38 = vmovdqa64_avx512f(local_900);
      auVar39 = vmovdqa64_avx512f(local_980);
      auVar40 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0);
      auVar38 = vmovdqa64_avx512f(local_900);
      auVar39 = vmovdqa64_avx512f(local_980);
      auVar39 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0x11);
      auVar38 = vmovdqa64_avx512f(local_940);
      auVar38 = vpternlogd_avx512f(auVar40,auVar39,auVar38,0x96);
      local_3200 = vmovdqa64_avx512f(auVar38);
      auVar38 = vmovdqa64_avx512f(local_3240);
      local_2700 = local_2f50 + 5;
      auVar39 = vmovdqu64_avx512f(*local_2700);
      auVar40 = vmovdqa64_avx512f(local_2fc0);
      local_3840 = vmovdqa64_avx512f(auVar38);
      local_3880 = vmovdqa64_avx512f(auVar39);
      local_38c0 = vmovdqa64_avx512f(auVar40);
      memcpy(local_b40,local_38c0,0x40);
      memcpy(local_b80,local_3880,0x40);
      memcpy(local_bc0,local_3840,0x40);
      auVar38 = vmovdqa64_avx512f(local_bc0);
      auVar39 = vmovdqa64_avx512f(local_b80);
      auVar40 = vmovdqa64_avx512f(local_b40);
      local_a80 = vmovdqa64_avx512f(auVar38);
      local_ac0 = vmovdqa64_avx512f(auVar39);
      local_b00 = vmovdqa64_avx512f(auVar40);
      auVar38 = vmovdqa64_avx512f(local_a80);
      auVar39 = vmovdqa64_avx512f(local_b00);
      auVar40 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0);
      auVar38 = vmovdqa64_avx512f(local_a80);
      auVar39 = vmovdqa64_avx512f(local_b00);
      auVar39 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0x11);
      auVar38 = vmovdqa64_avx512f(local_ac0);
      auVar38 = vpternlogd_avx512f(auVar40,auVar39,auVar38,0x96);
      local_3240 = vmovdqa64_avx512f(auVar38);
      auVar38 = vmovdqa64_avx512f(local_3280);
      local_2708 = local_2f50 + 6;
      auVar39 = vmovdqu64_avx512f(*local_2708);
      auVar40 = vmovdqa64_avx512f(local_2fc0);
      local_3900 = vmovdqa64_avx512f(auVar38);
      local_3940 = vmovdqa64_avx512f(auVar39);
      local_3980 = vmovdqa64_avx512f(auVar40);
      memcpy(local_cc0,local_3980,0x40);
      memcpy(local_d00,local_3940,0x40);
      memcpy(local_d40,local_3900,0x40);
      auVar38 = vmovdqa64_avx512f(local_d40);
      auVar39 = vmovdqa64_avx512f(local_d00);
      auVar40 = vmovdqa64_avx512f(local_cc0);
      local_c00 = vmovdqa64_avx512f(auVar38);
      local_c40 = vmovdqa64_avx512f(auVar39);
      local_c80 = vmovdqa64_avx512f(auVar40);
      auVar38 = vmovdqa64_avx512f(local_c00);
      auVar39 = vmovdqa64_avx512f(local_c80);
      auVar40 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0);
      auVar38 = vmovdqa64_avx512f(local_c00);
      auVar39 = vmovdqa64_avx512f(local_c80);
      auVar39 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0x11);
      auVar38 = vmovdqa64_avx512f(local_c40);
      auVar38 = vpternlogd_avx512f(auVar40,auVar39,auVar38,0x96);
      local_3280 = vmovdqa64_avx512f(auVar38);
      auVar38 = vmovdqa64_avx512f(local_32c0);
      local_2710 = local_2f50 + 7;
      auVar39 = vmovdqu64_avx512f(*local_2710);
      auVar40 = vmovdqa64_avx512f(local_2fc0);
      local_39c0 = vmovdqa64_avx512f(auVar38);
      local_3a00 = vmovdqa64_avx512f(auVar39);
      local_3a40 = vmovdqa64_avx512f(auVar40);
      memcpy(local_e40,local_3a40,0x40);
      memcpy(local_e80,local_3a00,0x40);
      memcpy(local_ec0,local_39c0,0x40);
      auVar38 = vmovdqa64_avx512f(local_ec0);
      auVar39 = vmovdqa64_avx512f(local_e80);
      auVar40 = vmovdqa64_avx512f(local_e40);
      local_d80 = vmovdqa64_avx512f(auVar38);
      local_dc0 = vmovdqa64_avx512f(auVar39);
      local_e00 = vmovdqa64_avx512f(auVar40);
      auVar38 = vmovdqa64_avx512f(local_d80);
      auVar39 = vmovdqa64_avx512f(local_e00);
      auVar40 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0);
      auVar38 = vmovdqa64_avx512f(local_d80);
      auVar39 = vmovdqa64_avx512f(local_e00);
      auVar39 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0x11);
      auVar38 = vmovdqa64_avx512f(local_dc0);
      auVar38 = vpternlogd_avx512f(auVar40,auVar39,auVar38,0x96);
      local_32c0 = vmovdqa64_avx512f(auVar38);
    }
    auVar38 = vmovdqa64_avx512f(local_3100);
    auVar39 = vmovdqa64_avx512f(local_3200);
    auVar40 = vmovdqa64_avx512f(local_3000);
    local_3a80 = vmovdqa64_avx512f(auVar38);
    local_3ac0 = vmovdqa64_avx512f(auVar39);
    local_3b00 = vmovdqa64_avx512f(auVar40);
    memcpy(local_fc0,local_3b00,0x40);
    memcpy(local_1000,local_3ac0,0x40);
    memcpy(local_1040,local_3a80,0x40);
    auVar38 = vmovdqa64_avx512f(local_1040);
    auVar39 = vmovdqa64_avx512f(local_1000);
    auVar40 = vmovdqa64_avx512f(local_fc0);
    local_f00 = vmovdqa64_avx512f(auVar38);
    local_f40 = vmovdqa64_avx512f(auVar39);
    local_f80 = vmovdqa64_avx512f(auVar40);
    auVar38 = vmovdqa64_avx512f(local_f00);
    auVar39 = vmovdqa64_avx512f(local_f80);
    auVar40 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0);
    auVar38 = vmovdqa64_avx512f(local_f00);
    auVar39 = vmovdqa64_avx512f(local_f80);
    auVar39 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0x11);
    auVar38 = vmovdqa64_avx512f(local_f40);
    auVar38 = vpternlogd_avx512f(auVar40,auVar39,auVar38,0x96);
    local_3100 = vmovdqa64_avx512f(auVar38);
    auVar38 = vmovdqa64_avx512f(local_3140);
    auVar39 = vmovdqa64_avx512f(local_3240);
    auVar40 = vmovdqa64_avx512f(local_3000);
    local_3b40 = vmovdqa64_avx512f(auVar38);
    local_3b80 = vmovdqa64_avx512f(auVar39);
    local_3bc0 = vmovdqa64_avx512f(auVar40);
    memcpy(local_1140,local_3bc0,0x40);
    memcpy(local_1180,local_3b80,0x40);
    memcpy(local_11c0,local_3b40,0x40);
    auVar38 = vmovdqa64_avx512f(local_11c0);
    auVar39 = vmovdqa64_avx512f(local_1180);
    auVar40 = vmovdqa64_avx512f(local_1140);
    local_1080 = vmovdqa64_avx512f(auVar38);
    local_10c0 = vmovdqa64_avx512f(auVar39);
    local_1100 = vmovdqa64_avx512f(auVar40);
    auVar38 = vmovdqa64_avx512f(local_1080);
    auVar39 = vmovdqa64_avx512f(local_1100);
    auVar40 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0);
    auVar38 = vmovdqa64_avx512f(local_1080);
    auVar39 = vmovdqa64_avx512f(local_1100);
    auVar39 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0x11);
    auVar38 = vmovdqa64_avx512f(local_10c0);
    auVar38 = vpternlogd_avx512f(auVar40,auVar39,auVar38,0x96);
    local_3140 = vmovdqa64_avx512f(auVar38);
    auVar38 = vmovdqa64_avx512f(local_3180);
    auVar39 = vmovdqa64_avx512f(local_3280);
    auVar40 = vmovdqa64_avx512f(local_3000);
    local_3c00 = vmovdqa64_avx512f(auVar38);
    local_3c40 = vmovdqa64_avx512f(auVar39);
    local_3c80 = vmovdqa64_avx512f(auVar40);
    memcpy(local_12c0,local_3c80,0x40);
    memcpy(local_1300,local_3c40,0x40);
    memcpy(local_1340,local_3c00,0x40);
    auVar38 = vmovdqa64_avx512f(local_1340);
    auVar39 = vmovdqa64_avx512f(local_1300);
    auVar40 = vmovdqa64_avx512f(local_12c0);
    local_1200 = vmovdqa64_avx512f(auVar38);
    local_1240 = vmovdqa64_avx512f(auVar39);
    local_1280 = vmovdqa64_avx512f(auVar40);
    auVar38 = vmovdqa64_avx512f(local_1200);
    auVar39 = vmovdqa64_avx512f(local_1280);
    auVar40 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0);
    auVar38 = vmovdqa64_avx512f(local_1200);
    auVar39 = vmovdqa64_avx512f(local_1280);
    auVar39 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0x11);
    auVar38 = vmovdqa64_avx512f(local_1240);
    auVar38 = vpternlogd_avx512f(auVar40,auVar39,auVar38,0x96);
    local_3180 = vmovdqa64_avx512f(auVar38);
    auVar38 = vmovdqa64_avx512f(local_31c0);
    auVar39 = vmovdqa64_avx512f(local_32c0);
    auVar40 = vmovdqa64_avx512f(local_3000);
    local_3cc0 = vmovdqa64_avx512f(auVar38);
    local_3d00 = vmovdqa64_avx512f(auVar39);
    local_3d40 = vmovdqa64_avx512f(auVar40);
    memcpy(local_1440,local_3d40,0x40);
    memcpy(local_1480,local_3d00,0x40);
    memcpy(local_14c0,local_3cc0,0x40);
    auVar38 = vmovdqa64_avx512f(local_14c0);
    auVar39 = vmovdqa64_avx512f(local_1480);
    auVar40 = vmovdqa64_avx512f(local_1440);
    local_1380 = vmovdqa64_avx512f(auVar38);
    local_13c0 = vmovdqa64_avx512f(auVar39);
    local_1400 = vmovdqa64_avx512f(auVar40);
    auVar38 = vmovdqa64_avx512f(local_1380);
    auVar39 = vmovdqa64_avx512f(local_1400);
    auVar40 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0);
    auVar38 = vmovdqa64_avx512f(local_1380);
    auVar39 = vmovdqa64_avx512f(local_1400);
    auVar39 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0x11);
    auVar38 = vmovdqa64_avx512f(local_13c0);
    auVar38 = vpternlogd_avx512f(auVar40,auVar39,auVar38,0x96);
    local_31c0 = vmovdqa64_avx512f(auVar38);
    if ((local_2f58 & 0x100) != 0) {
      auVar38 = vmovdqa64_avx512f(local_3100);
      local_2718 = local_2f50;
      auVar39 = vmovdqu64_avx512f(*local_2f50);
      auVar40 = vmovdqa64_avx512f(local_3000);
      local_3d80 = vmovdqa64_avx512f(auVar38);
      local_3dc0 = vmovdqa64_avx512f(auVar39);
      local_3e00 = vmovdqa64_avx512f(auVar40);
      memcpy(local_15c0,local_3e00,0x40);
      memcpy(local_1600,local_3dc0,0x40);
      memcpy(local_1640,local_3d80,0x40);
      auVar38 = vmovdqa64_avx512f(local_1640);
      auVar39 = vmovdqa64_avx512f(local_1600);
      auVar40 = vmovdqa64_avx512f(local_15c0);
      local_1500 = vmovdqa64_avx512f(auVar38);
      local_1540 = vmovdqa64_avx512f(auVar39);
      local_1580 = vmovdqa64_avx512f(auVar40);
      auVar38 = vmovdqa64_avx512f(local_1500);
      auVar39 = vmovdqa64_avx512f(local_1580);
      auVar40 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0);
      auVar38 = vmovdqa64_avx512f(local_1500);
      auVar39 = vmovdqa64_avx512f(local_1580);
      auVar39 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0x11);
      auVar38 = vmovdqa64_avx512f(local_1540);
      auVar38 = vpternlogd_avx512f(auVar40,auVar39,auVar38,0x96);
      local_3100 = vmovdqa64_avx512f(auVar38);
      auVar38 = vmovdqa64_avx512f(local_3140);
      local_2720 = local_2f50 + 1;
      auVar39 = vmovdqu64_avx512f(*local_2720);
      auVar40 = vmovdqa64_avx512f(local_3000);
      local_3e40 = vmovdqa64_avx512f(auVar38);
      local_3e80 = vmovdqa64_avx512f(auVar39);
      local_3ec0 = vmovdqa64_avx512f(auVar40);
      memcpy(local_1740,local_3ec0,0x40);
      memcpy(local_1780,local_3e80,0x40);
      memcpy(local_17c0,local_3e40,0x40);
      auVar38 = vmovdqa64_avx512f(local_17c0);
      auVar39 = vmovdqa64_avx512f(local_1780);
      auVar40 = vmovdqa64_avx512f(local_1740);
      local_1680 = vmovdqa64_avx512f(auVar38);
      local_16c0 = vmovdqa64_avx512f(auVar39);
      local_1700 = vmovdqa64_avx512f(auVar40);
      auVar38 = vmovdqa64_avx512f(local_1680);
      auVar39 = vmovdqa64_avx512f(local_1700);
      auVar40 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0);
      auVar38 = vmovdqa64_avx512f(local_1680);
      auVar39 = vmovdqa64_avx512f(local_1700);
      auVar39 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0x11);
      auVar38 = vmovdqa64_avx512f(local_16c0);
      auVar38 = vpternlogd_avx512f(auVar40,auVar39,auVar38,0x96);
      local_3140 = vmovdqa64_avx512f(auVar38);
      auVar38 = vmovdqa64_avx512f(local_3180);
      local_2728 = local_2f50 + 2;
      auVar39 = vmovdqu64_avx512f(*local_2728);
      auVar40 = vmovdqa64_avx512f(local_3000);
      local_3f00 = vmovdqa64_avx512f(auVar38);
      local_3f40 = vmovdqa64_avx512f(auVar39);
      local_3f80 = vmovdqa64_avx512f(auVar40);
      memcpy(local_18c0,local_3f80,0x40);
      memcpy(local_1900,local_3f40,0x40);
      memcpy(local_1940,local_3f00,0x40);
      auVar38 = vmovdqa64_avx512f(local_1940);
      auVar39 = vmovdqa64_avx512f(local_1900);
      auVar40 = vmovdqa64_avx512f(local_18c0);
      local_1800 = vmovdqa64_avx512f(auVar38);
      local_1840 = vmovdqa64_avx512f(auVar39);
      local_1880 = vmovdqa64_avx512f(auVar40);
      auVar38 = vmovdqa64_avx512f(local_1800);
      auVar39 = vmovdqa64_avx512f(local_1880);
      auVar40 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0);
      auVar38 = vmovdqa64_avx512f(local_1800);
      auVar39 = vmovdqa64_avx512f(local_1880);
      auVar39 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0x11);
      auVar38 = vmovdqa64_avx512f(local_1840);
      auVar38 = vpternlogd_avx512f(auVar40,auVar39,auVar38,0x96);
      local_3180 = vmovdqa64_avx512f(auVar38);
      auVar38 = vmovdqa64_avx512f(local_31c0);
      local_2730 = local_2f50 + 3;
      auVar39 = vmovdqu64_avx512f(*local_2730);
      auVar40 = vmovdqa64_avx512f(local_3000);
      local_3fc0 = vmovdqa64_avx512f(auVar38);
      local_4000 = vmovdqa64_avx512f(auVar39);
      local_4040 = vmovdqa64_avx512f(auVar40);
      memcpy(local_1a40,local_4040,0x40);
      memcpy(local_1a80,local_4000,0x40);
      memcpy(local_1ac0,local_3fc0,0x40);
      auVar38 = vmovdqa64_avx512f(local_1ac0);
      auVar39 = vmovdqa64_avx512f(local_1a80);
      auVar40 = vmovdqa64_avx512f(local_1a40);
      local_1980 = vmovdqa64_avx512f(auVar38);
      local_19c0 = vmovdqa64_avx512f(auVar39);
      local_1a00 = vmovdqa64_avx512f(auVar40);
      auVar38 = vmovdqa64_avx512f(local_1980);
      auVar39 = vmovdqa64_avx512f(local_1a00);
      auVar40 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0);
      auVar38 = vmovdqa64_avx512f(local_1980);
      auVar39 = vmovdqa64_avx512f(local_1a00);
      auVar39 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0x11);
      auVar38 = vmovdqa64_avx512f(local_19c0);
      auVar38 = vpternlogd_avx512f(auVar40,auVar39,auVar38,0x96);
      local_31c0 = vmovdqa64_avx512f(auVar38);
      local_2f50 = local_2f50 + 4;
    }
LAB_00125f92:
    auVar38 = vmovdqa64_avx512f(local_3100);
    auVar39 = vmovdqa64_avx512f(local_3180);
    auVar40 = vmovdqa64_avx512f(local_3040);
    local_4080 = vmovdqa64_avx512f(auVar38);
    local_40c0 = vmovdqa64_avx512f(auVar39);
    local_4100 = vmovdqa64_avx512f(auVar40);
    memcpy(local_1bc0,local_4100,0x40);
    memcpy(local_1c00,local_40c0,0x40);
    memcpy(local_1c40,local_4080,0x40);
    auVar38 = vmovdqa64_avx512f(local_1c40);
    auVar39 = vmovdqa64_avx512f(local_1c00);
    auVar40 = vmovdqa64_avx512f(local_1bc0);
    local_1b00 = vmovdqa64_avx512f(auVar38);
    local_1b40 = vmovdqa64_avx512f(auVar39);
    local_1b80 = vmovdqa64_avx512f(auVar40);
    auVar38 = vmovdqa64_avx512f(local_1b00);
    auVar39 = vmovdqa64_avx512f(local_1b80);
    auVar40 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0);
    auVar38 = vmovdqa64_avx512f(local_1b00);
    auVar39 = vmovdqa64_avx512f(local_1b80);
    auVar39 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0x11);
    auVar38 = vmovdqa64_avx512f(local_1b40);
    auVar38 = vpternlogd_avx512f(auVar40,auVar39,auVar38,0x96);
    local_3100 = vmovdqa64_avx512f(auVar38);
    auVar38 = vmovdqa64_avx512f(local_3140);
    auVar39 = vmovdqa64_avx512f(local_31c0);
    auVar40 = vmovdqa64_avx512f(local_3040);
    local_4140 = vmovdqa64_avx512f(auVar38);
    local_4180 = vmovdqa64_avx512f(auVar39);
    local_41c0 = vmovdqa64_avx512f(auVar40);
    memcpy(local_1d40,local_41c0,0x40);
    memcpy(local_1d80,local_4180,0x40);
    memcpy(local_1dc0,local_4140,0x40);
    auVar38 = vmovdqa64_avx512f(local_1dc0);
    auVar39 = vmovdqa64_avx512f(local_1d80);
    auVar40 = vmovdqa64_avx512f(local_1d40);
    local_1c80 = vmovdqa64_avx512f(auVar38);
    local_1cc0 = vmovdqa64_avx512f(auVar39);
    local_1d00 = vmovdqa64_avx512f(auVar40);
    auVar38 = vmovdqa64_avx512f(local_1c80);
    auVar39 = vmovdqa64_avx512f(local_1d00);
    auVar40 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0);
    auVar38 = vmovdqa64_avx512f(local_1c80);
    auVar39 = vmovdqa64_avx512f(local_1d00);
    auVar39 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0x11);
    auVar38 = vmovdqa64_avx512f(local_1cc0);
    auVar38 = vpternlogd_avx512f(auVar40,auVar39,auVar38,0x96);
    local_3140 = vmovdqa64_avx512f(auVar38);
    if ((local_2f58 & 0x80) != 0) {
      auVar38 = vmovdqa64_avx512f(local_3100);
      local_2738 = local_2f50;
      auVar39 = vmovdqu64_avx512f(*local_2f50);
      auVar40 = vmovdqa64_avx512f(local_3040);
      local_4200 = vmovdqa64_avx512f(auVar38);
      local_4240 = vmovdqa64_avx512f(auVar39);
      local_4280 = vmovdqa64_avx512f(auVar40);
      memcpy(local_1ec0,local_4280,0x40);
      memcpy(local_1f00,local_4240,0x40);
      memcpy(local_1f40,local_4200,0x40);
      auVar38 = vmovdqa64_avx512f(local_1f40);
      auVar39 = vmovdqa64_avx512f(local_1f00);
      auVar40 = vmovdqa64_avx512f(local_1ec0);
      local_1e00 = vmovdqa64_avx512f(auVar38);
      local_1e40 = vmovdqa64_avx512f(auVar39);
      local_1e80 = vmovdqa64_avx512f(auVar40);
      auVar38 = vmovdqa64_avx512f(local_1e00);
      auVar39 = vmovdqa64_avx512f(local_1e80);
      auVar40 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0);
      auVar38 = vmovdqa64_avx512f(local_1e00);
      auVar39 = vmovdqa64_avx512f(local_1e80);
      auVar39 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0x11);
      auVar38 = vmovdqa64_avx512f(local_1e40);
      auVar38 = vpternlogd_avx512f(auVar40,auVar39,auVar38,0x96);
      local_3100 = vmovdqa64_avx512f(auVar38);
      auVar38 = vmovdqa64_avx512f(local_3140);
      local_2740 = local_2f50 + 1;
      auVar39 = vmovdqu64_avx512f(*local_2740);
      auVar40 = vmovdqa64_avx512f(local_3040);
      local_42c0 = vmovdqa64_avx512f(auVar38);
      local_4300 = vmovdqa64_avx512f(auVar39);
      local_4340 = vmovdqa64_avx512f(auVar40);
      memcpy(local_2040,local_4340,0x40);
      memcpy(local_2080,local_4300,0x40);
      memcpy(local_20c0,local_42c0,0x40);
      auVar38 = vmovdqa64_avx512f(local_20c0);
      auVar39 = vmovdqa64_avx512f(local_2080);
      auVar40 = vmovdqa64_avx512f(local_2040);
      local_1f80 = vmovdqa64_avx512f(auVar38);
      local_1fc0 = vmovdqa64_avx512f(auVar39);
      local_2000 = vmovdqa64_avx512f(auVar40);
      auVar38 = vmovdqa64_avx512f(local_1f80);
      auVar39 = vmovdqa64_avx512f(local_2000);
      auVar40 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0);
      auVar38 = vmovdqa64_avx512f(local_1f80);
      auVar39 = vmovdqa64_avx512f(local_2000);
      auVar39 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0x11);
      auVar38 = vmovdqa64_avx512f(local_1fc0);
      auVar38 = vpternlogd_avx512f(auVar40,auVar39,auVar38,0x96);
      local_3140 = vmovdqa64_avx512f(auVar38);
      local_2f50 = local_2f50 + 2;
    }
  }
  auVar38 = vmovdqa64_avx512f(local_3100);
  auVar39 = vmovdqa64_avx512f(local_3140);
  auVar40 = vmovdqa64_avx512f(local_3080);
  local_4380 = vmovdqa64_avx512f(auVar38);
  local_43c0 = vmovdqa64_avx512f(auVar39);
  local_4400 = vmovdqa64_avx512f(auVar40);
  memcpy(local_21c0,local_4400,0x40);
  memcpy(local_2200,local_43c0,0x40);
  memcpy(local_2240,local_4380,0x40);
  auVar38 = vmovdqa64_avx512f(local_2240);
  auVar39 = vmovdqa64_avx512f(local_2200);
  auVar40 = vmovdqa64_avx512f(local_21c0);
  local_2100 = vmovdqa64_avx512f(auVar38);
  local_2140 = vmovdqa64_avx512f(auVar39);
  local_2180 = vmovdqa64_avx512f(auVar40);
  auVar38 = vmovdqa64_avx512f(local_2100);
  auVar39 = vmovdqa64_avx512f(local_2180);
  auVar40 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0);
  auVar38 = vmovdqa64_avx512f(local_2100);
  auVar39 = vmovdqa64_avx512f(local_2180);
  auVar39 = vpclmulqdq_vpclmulqdq(auVar38,auVar39,0x11);
  auVar38 = vmovdqa64_avx512f(local_2140);
  auVar38 = vpternlogd_avx512f(auVar40,auVar39,auVar38,0x96);
  local_3100 = vmovdqa64_avx512f(auVar38);
  if ((local_2f58 & 0x40) != 0) {
    auVar38 = vmovdqa64_avx512f(local_3100);
    local_2748 = local_2f50;
    auVar39 = vmovdqu64_avx512f(*local_2f50);
    auVar40 = vmovdqa64_avx512f(local_3080);
    local_4440 = vmovdqa64_avx512f(auVar38);
    local_4480 = vmovdqa64_avx512f(auVar39);
    local_44c0 = vmovdqa64_avx512f(auVar40);
    memcpy(local_2340,local_44c0,0x40);
    memcpy(local_2380,local_4480,0x40);
    memcpy(local_23c0,local_4440,0x40);
    auVar38 = vmovdqa64_avx512f(local_23c0);
    auVar39 = vmovdqa64_avx512f(local_2380);
    auVar40 = vmovdqa64_avx512f(local_2340[0]);
    auVar38 = vmovdqa64_avx512f(auVar38);
    auVar39 = vmovdqa64_avx512f(auVar39);
    auVar40 = vmovdqa64_avx512f(auVar40);
    auVar41 = vmovdqa64_avx512f(auVar38);
    auVar42 = vmovdqa64_avx512f(auVar40);
    auVar41 = vpclmulqdq_vpclmulqdq(auVar41,auVar42,0);
    auVar38 = vmovdqa64_avx512f(auVar38);
    auVar40 = vmovdqa64_avx512f(auVar40);
    auVar40 = vpclmulqdq_vpclmulqdq(auVar38,auVar40,0x11);
    auVar38 = vmovdqa64_avx512f(auVar39);
    auVar38 = vpternlogd_avx512f(auVar41,auVar40,auVar38,0x96);
    vmovdqa64_avx512f(auVar38);
  }
LAB_001266be:
  vpunpcklqdq_avx(ZEXT816(0xf1da05aa),ZEXT816(0x81256527));
  vpunpcklqdq_avx(ZEXT816(0xf1da05aa),ZEXT816(0x81256527));
  halt_baddata();
}

Assistant:

static ATTRIBUTES u32
ADD_SUFFIX(crc32_x86)(u32 crc, const u8 *p, size_t len)
{
	/*
	 * mults_{N}v are the vectors of multipliers for folding across N vec_t
	 * vectors, i.e. N*VL*8 bits.  mults_128b are the two multipliers for
	 * folding across 128 bits.  mults_128b differs from mults_1v when
	 * VL != 16.  All multipliers are 64-bit, to match what pclmulqdq needs,
	 * but since this is for CRC-32 only their low 32 bits are nonzero.
	 * For more details, see scripts/gen-crc32-consts.py.
	 */
	const vec_t mults_8v = MULTS_8V;
	const vec_t mults_4v = MULTS_4V;
	const vec_t mults_2v = MULTS_2V;
	const vec_t mults_1v = MULTS_1V;
	const __m128i mults_128b = _mm_set_epi64x(CRC32_X95_MODG, CRC32_X159_MODG);
	const __m128i barrett_reduction_constants =
		_mm_set_epi64x(CRC32_BARRETT_CONSTANT_2, CRC32_BARRETT_CONSTANT_1);
	vec_t v0, v1, v2, v3, v4, v5, v6, v7;
	__m128i x0 = _mm_cvtsi32_si128(crc);
	__m128i x1;

	if (len < 8*VL) {
		if (len < VL) {
			STATIC_ASSERT(VL == 16 || VL == 32 || VL == 64);
			if (len < 16) {
			#if USE_AVX512
				if (len < 4)
					return crc32_slice1(crc, p, len);
				/*
				 * Handle 4 <= len <= 15 bytes by doing a masked
				 * load, XOR'ing the current CRC with the first
				 * 4 bytes, left-shifting by '16 - len' bytes to
				 * align the result to the end of x0 (so that it
				 * becomes the low-order coefficients of a
				 * 128-bit polynomial), and then doing the usual
				 * reduction from 128 bits to 32 bits.
				 */
				x0 = _mm_xor_si128(
					x0, _mm_maskz_loadu_epi8((1 << len) - 1, p));
				x0 = _mm_shuffle_epi8(
					x0, _mm_loadu_si128((const void *)&shift_tab[len]));
				goto reduce_x0;
			#else
				return crc32_slice1(crc, p, len);
			#endif
			}
			/*
			 * Handle 16 <= len < VL bytes where VL is 32 or 64.
			 * Use 128-bit instructions so that these lengths aren't
			 * slower with VL > 16 than with VL=16.
			 */
			x0 = _mm_xor_si128(_mm_loadu_si128((const void *)p), x0);
			if (len >= 32) {
				x0 = fold_vec128(x0, _mm_loadu_si128((const void *)(p + 16)),
						 mults_128b);
				if (len >= 48)
					x0 = fold_vec128(x0, _mm_loadu_si128((const void *)(p + 32)),
							 mults_128b);
			}
			p += len & ~15;
			goto less_than_16_remaining;
		}
		v0 = VXOR(VLOADU(p), M128I_TO_VEC(x0));
		if (len < 2*VL) {
			p += VL;
			goto less_than_vl_remaining;
		}
		v1 = VLOADU(p + 1*VL);
		if (len < 4*VL) {
			p += 2*VL;
			goto less_than_2vl_remaining;
		}
		v2 = VLOADU(p + 2*VL);
		v3 = VLOADU(p + 3*VL);
		p += 4*VL;
	} else {
		/*
		 * If the length is large and the pointer is misaligned, align
		 * it.  For smaller lengths, just take the misaligned load
		 * penalty.  Note that on recent x86 CPUs, vmovdqu with an
		 * aligned address is just as fast as vmovdqa, so there's no
		 * need to use vmovdqa in the main loop.
		 */
		if (len > 65536 && ((uintptr_t)p & (VL-1))) {
			size_t align = -(uintptr_t)p & (VL-1);

			len -= align;
			x0 = _mm_xor_si128(_mm_loadu_si128((const void *)p), x0);
			p += 16;
			if (align & 15) {
				x0 = fold_lessthan16bytes(x0, p, align & 15,
							  mults_128b);
				p += align & 15;
				align &= ~15;
			}
			while (align) {
				x0 = fold_vec128(x0, *(const __m128i *)p,
						 mults_128b);
				p += 16;
				align -= 16;
			}
			v0 = M128I_TO_VEC(x0);
		#  if VL == 32
			v0 = _mm256_inserti128_si256(v0, *(const __m128i *)p, 1);
		#  elif VL == 64
			v0 = _mm512_inserti32x4(v0, *(const __m128i *)p, 1);
			v0 = _mm512_inserti64x4(v0, *(const __m256i *)(p + 16), 1);
		#  endif
			p -= 16;
		} else {
			v0 = VXOR(VLOADU(p), M128I_TO_VEC(x0));
		}
		v1 = VLOADU(p + 1*VL);
		v2 = VLOADU(p + 2*VL);
		v3 = VLOADU(p + 3*VL);
		v4 = VLOADU(p + 4*VL);
		v5 = VLOADU(p + 5*VL);
		v6 = VLOADU(p + 6*VL);
		v7 = VLOADU(p + 7*VL);
		p += 8*VL;

		/*
		 * This is the main loop, processing 8*VL bytes per iteration.
		 * 4*VL is usually enough and would result in smaller code, but
		 * Skylake and Cascade Lake need 8*VL to get full performance.
		 */
		while (len >= 16*VL) {
			v0 = fold_vec(v0, VLOADU(p + 0*VL), mults_8v);
			v1 = fold_vec(v1, VLOADU(p + 1*VL), mults_8v);
			v2 = fold_vec(v2, VLOADU(p + 2*VL), mults_8v);
			v3 = fold_vec(v3, VLOADU(p + 3*VL), mults_8v);
			v4 = fold_vec(v4, VLOADU(p + 4*VL), mults_8v);
			v5 = fold_vec(v5, VLOADU(p + 5*VL), mults_8v);
			v6 = fold_vec(v6, VLOADU(p + 6*VL), mults_8v);
			v7 = fold_vec(v7, VLOADU(p + 7*VL), mults_8v);
			p += 8*VL;
			len -= 8*VL;
		}

		/* Fewer than 8*VL bytes remain. */
		v0 = fold_vec(v0, v4, mults_4v);
		v1 = fold_vec(v1, v5, mults_4v);
		v2 = fold_vec(v2, v6, mults_4v);
		v3 = fold_vec(v3, v7, mults_4v);
		if (len & (4*VL)) {
			v0 = fold_vec(v0, VLOADU(p + 0*VL), mults_4v);
			v1 = fold_vec(v1, VLOADU(p + 1*VL), mults_4v);
			v2 = fold_vec(v2, VLOADU(p + 2*VL), mults_4v);
			v3 = fold_vec(v3, VLOADU(p + 3*VL), mults_4v);
			p += 4*VL;
		}
	}
	/* Fewer than 4*VL bytes remain. */
	v0 = fold_vec(v0, v2, mults_2v);
	v1 = fold_vec(v1, v3, mults_2v);
	if (len & (2*VL)) {
		v0 = fold_vec(v0, VLOADU(p + 0*VL), mults_2v);
		v1 = fold_vec(v1, VLOADU(p + 1*VL), mults_2v);
		p += 2*VL;
	}
less_than_2vl_remaining:
	/* Fewer than 2*VL bytes remain. */
	v0 = fold_vec(v0, v1, mults_1v);
	if (len & VL) {
		v0 = fold_vec(v0, VLOADU(p), mults_1v);
		p += VL;
	}
less_than_vl_remaining:
	/*
	 * Fewer than VL bytes remain.  Reduce v0 (length VL bytes) to x0
	 * (length 16 bytes) and fold in any 16-byte data segments that remain.
	 */
#if VL == 16
	x0 = v0;
#else
	{
	#if VL == 32
		__m256i y0 = v0;
	#else
		const __m256i mults_256b =
			_mm256_set_epi64x(CRC32_X223_MODG, CRC32_X287_MODG,
					  CRC32_X223_MODG, CRC32_X287_MODG);
		__m256i y0 = fold_vec256(_mm512_extracti64x4_epi64(v0, 0),
					 _mm512_extracti64x4_epi64(v0, 1),
					 mults_256b);
		if (len & 32) {
			y0 = fold_vec256(y0, _mm256_loadu_si256((const void *)p),
					 mults_256b);
			p += 32;
		}
	#endif
		x0 = fold_vec128(_mm256_extracti128_si256(y0, 0),
				 _mm256_extracti128_si256(y0, 1), mults_128b);
	}
	if (len & 16) {
		x0 = fold_vec128(x0, _mm_loadu_si128((const void *)p),
				 mults_128b);
		p += 16;
	}
#endif
less_than_16_remaining:
	len &= 15;

	/* Handle any remainder of 1 to 15 bytes. */
	if (len)
		x0 = fold_lessthan16bytes(x0, p, len, mults_128b);
#if USE_AVX512
reduce_x0:
#endif
	/*
	 * Multiply the remaining 128-bit message polynomial 'x0' by x^32, then
	 * reduce it modulo the generator polynomial G.  This gives the CRC.
	 *
	 * This implementation matches that used in crc-pclmul-template.S from
	 * https://lore.kernel.org/r/20250210174540.161705-4-ebiggers@kernel.org/
	 * with the parameters n=32 and LSB_CRC=1 (what the gzip CRC uses).  See
	 * there for a detailed explanation of the math used here.
	 */
	x0 = _mm_xor_si128(_mm_clmulepi64_si128(x0, mults_128b, 0x10),
			   _mm_bsrli_si128(x0, 8));
	x1 = _mm_clmulepi64_si128(x0, barrett_reduction_constants, 0x00);
	x1 = _mm_clmulepi64_si128(x1, barrett_reduction_constants, 0x10);
	x0 = _mm_xor_si128(x0, x1);
	return _mm_extract_epi32(x0, 2);
}